

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastStFldForCustomProperty(Lowerer *this,Instr *instr,LabelInstr **labelHelperRef)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  BailOutKind BVar3;
  undefined4 *puVar4;
  SymOpnd *this_00;
  PropertySym *pPVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar6;
  Opnd *compareSrc2;
  IntConstOpnd *src;
  LabelInstr *target;
  undefined1 local_58 [8];
  AutoReuseOpnd autoReuseObjectOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType objectValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2b,"(instr)","instr");
    if (!bVar2) goto LAB_0056a210;
    *puVar4 = 0;
  }
  if (labelHelperRef == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2c,"(labelHelperRef)","labelHelperRef");
    if (!bVar2) goto LAB_0056a210;
    *puVar4 = 0;
  }
  if (*labelHelperRef != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2d,"(!*labelHelperRef)","!*labelHelperRef");
    if (!bVar2) {
LAB_0056a210:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((instr->m_opcode == StFldStrict) || (instr->m_opcode == StFld)) {
    this_00 = IR::Opnd::AsSymOpnd(instr->m_dst);
    pPVar5 = Sym::AsPropertySym(this_00->m_sym);
    if ((pPVar5->m_propertyId == 0x1a2) && (bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00), bVar2))
    {
      local_32[0] = (this_00->propertyOwnerValueType).field_0;
      bVar2 = ValueType::IsLikelyRegExp((ValueType *)&local_32[0].field_0);
      if ((bVar2) &&
         (((instr->field_0x38 & 0x10) == 0 ||
          (BVar3 = IR::Instr::GetBailOutKind(instr),
          (BVar3 & ~BailOutIntOnly) == BailOutOnImplicitCalls)))) {
        func = instr->m_func;
        baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(this_00,func);
        IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_58,&baseOpnd->super_Opnd,func,true);
        bVar2 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
        if (bVar2) {
          autoReuseObjectOpnd.autoDelete = false;
          autoReuseObjectOpnd.wasInUse = false;
          autoReuseObjectOpnd._18_6_ = 0;
        }
        else {
          autoReuseObjectOpnd._16_8_ = IR::LabelInstr::New(Label,func,true);
          *labelHelperRef = (LabelInstr *)autoReuseObjectOpnd._16_8_;
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&baseOpnd->super_Opnd,instr,
                     (LabelInstr *)autoReuseObjectOpnd._16_8_,false);
        }
        bVar2 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
        if (!bVar2) {
          if (autoReuseObjectOpnd._16_8_ == 0) {
            autoReuseObjectOpnd._16_8_ = IR::LabelInstr::New(Label,func,true);
            *labelHelperRef = (LabelInstr *)autoReuseObjectOpnd._16_8_;
          }
          pIVar6 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,func,false);
          compareSrc2 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
          InsertCompareBranch(this,&pIVar6->super_Opnd,compareSrc2,BrNeq_A,
                              (LabelInstr *)autoReuseObjectOpnd._16_8_,instr,false);
          valueType = ValueType::ToDefiniteObject((ValueType *)&local_32[0].field_0);
          IR::Opnd::SetValueType(&baseOpnd->super_Opnd,valueType);
        }
        pIVar6 = IR::IndirOpnd::New(baseOpnd,0x30,TyVar,func,false);
        InsertMove(&pIVar6->super_Opnd,instr->m_src1,instr,true);
        pIVar6 = IR::IndirOpnd::New(baseOpnd,0x38,TyUint32,func,false);
        src = IR::IntConstOpnd::New(0xfffffffe,TyUint32,func,true);
        InsertMove(&pIVar6->super_Opnd,&src->super_Opnd,instr,true);
        target = IR::Instr::GetOrCreateContinueLabel(instr,false);
        InsertBranch(Br,target,instr);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Lowerer::GenerateFastStFldForCustomProperty(IR::Instr *const instr, IR::LabelInstr * *const labelHelperRef)
{
    Assert(instr);
    Assert(labelHelperRef);
    Assert(!*labelHelperRef);

    switch(instr->m_opcode)
    {
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
            break;

        default:
            return false;
    }

    IR::SymOpnd *const symOpnd = instr->GetDst()->AsSymOpnd();
    PropertySym *const propertySym = symOpnd->m_sym->AsPropertySym();
    if(propertySym->m_propertyId != Js::PropertyIds::lastIndex || !symOpnd->IsPropertySymOpnd())
    {
        return false;
    }

    const ValueType objectValueType(symOpnd->GetPropertyOwnerValueType());
    if(!objectValueType.IsLikelyRegExp())
    {
        return false;
    }

    if(instr->HasBailOutInfo())
    {
        const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if(!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind) || bailOutKind & IR::BailOutKindBits)
        {
            // Other bailout kinds will likely need bailout checks that would not be generated here. In particular, if a type
            // check is necessary here to guard against downstream property accesses on the same object, the type check will
            // fail and cause a bailout if the object is a RegExp object since the "lastIndex" property accesses are not cached.
            return false;
        }
    }

    Func *const func = instr->m_func;

    IR::RegOpnd *const objectOpnd = symOpnd->CreatePropertyOwnerOpnd(func);
    const IR::AutoReuseOpnd autoReuseObjectOpnd(objectOpnd, func);

    IR::LabelInstr *labelHelper = nullptr;
    if(!objectOpnd->IsNotTaggedValue())
    {
        //     test object, 1
        //     jnz $helper
        if(!labelHelper)
        {
            *labelHelperRef = labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        m_lowererMD.GenerateObjectTest(objectOpnd, instr, labelHelper);
    }

    if(!objectValueType.IsObject())
    {
        //     cmp [object], Js::JavascriptRegExp::vtable
        //     jne $helper
        if(!labelHelper)
        {
            *labelHelperRef = labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        InsertCompareBranch(
            IR::IndirOpnd::New(objectOpnd, 0, TyMachPtr, func),
            LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp),
            Js::OpCode::BrNeq_A,
            labelHelper,
            instr);
        objectOpnd->SetValueType(objectValueType.ToDefiniteObject());
    }

    //     mov [object + offset(lastIndexVar)], src
    //     mov [object + offset(lastIndexOrFlag)], Js::JavascriptRegExp::NotCachedValue
    //     jmp $done
    InsertMove(
        IR::IndirOpnd::New(objectOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), TyVar, func),
        instr->GetSrc1(),
        instr);
    InsertMove(
        IR::IndirOpnd::New(objectOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), TyUint32, func),
        IR::IntConstOpnd::New(Js::JavascriptRegExp::NotCachedValue, TyUint32, func, true),
        instr);
    InsertBranch(Js::OpCode::Br, instr->GetOrCreateContinueLabel(), instr);

    return true;
}